

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNonDsd.c
# Opt level: O1

int Dau_DecCheckSetTop5(word *p,int nVars,int nVarsF,int nVarsB,int nVarsS,int uMaskS,int *pSched,
                       word *pDec,word *pComp)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  byte bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  byte *pbVar18;
  int pVarsS [16];
  word Cof [2] [64];
  byte local_4b8 [64];
  byte local_478 [64];
  ulong auStack_438 [64];
  ulong auStack_238 [65];
  
  bVar1 = (byte)nVarsF;
  uVar2 = 1 << ((byte)nVarsB & 0x1f);
  uVar9 = 1 << ((byte)nVarsS & 0x1f);
  if (nVarsB + nVarsF != nVars) {
    __assert_fail("nVars == nVarsB + nVarsF",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauNonDsd.c"
                  ,0x38,
                  "int Dau_DecCheckSetTop5(word *, int, int, int, int, int, int *, word *, word *)")
    ;
  }
  if (0x10 < nVars) {
    __assert_fail("nVars <= 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauNonDsd.c"
                  ,0x39,
                  "int Dau_DecCheckSetTop5(word *, int, int, int, int, int, int *, word *, word *)")
    ;
  }
  if (6 < nVarsS) {
    __assert_fail("nVarsS <= 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauNonDsd.c"
                  ,0x3a,
                  "int Dau_DecCheckSetTop5(word *, int, int, int, int, int, int *, word *, word *)")
    ;
  }
  if (4 < nVarsF - 1U) {
    __assert_fail("nVarsF >= 1 && nVarsF <= 5",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauNonDsd.c"
                  ,0x3b,
                  "int Dau_DecCheckSetTop5(word *, int, int, int, int, int, int *, word *, word *)")
    ;
  }
  if (nVarsB < 1) {
    iVar3 = 0;
    iVar6 = 0;
  }
  else {
    uVar13 = 0;
    iVar6 = 0;
    iVar3 = 0;
    do {
      if (((uint)uMaskS >> ((uint)uVar13 & 0x1f) & 1) == 0) {
        pbVar18 = local_478 + uVar13 * 4;
        pbVar18[0] = 0xff;
        pbVar18[1] = 0xff;
        pbVar18[2] = 0xff;
        pbVar18[3] = 0xff;
        pbVar18 = local_4b8;
        iVar8 = iVar6 + 1;
        iVar7 = iVar6;
      }
      else {
        pbVar18 = local_4b8 + uVar13 * 4;
        pbVar18[0] = 0xff;
        pbVar18[1] = 0xff;
        pbVar18[2] = 0xff;
        pbVar18[3] = 0xff;
        pbVar18 = local_478;
        iVar8 = iVar6;
        iVar7 = iVar3;
        iVar3 = iVar3 + 1;
      }
      iVar6 = iVar8;
      *(int *)(pbVar18 + uVar13 * 4) = iVar7;
      uVar13 = uVar13 + 1;
    } while ((uint)nVarsB != uVar13);
  }
  if (iVar3 != nVarsS) {
    __assert_fail("s == nVarsS",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauNonDsd.c"
                  ,0x42,
                  "int Dau_DecCheckSetTop5(word *, int, int, int, int, int, int *, word *, word *)")
    ;
  }
  if (iVar6 != nVarsB - nVarsS) {
    __assert_fail("b == nVarsB-nVarsS",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauNonDsd.c"
                  ,0x43,
                  "int Dau_DecCheckSetTop5(word *, int, int, int, int, int, int *, word *, word *)")
    ;
  }
  bVar5 = 6 - bVar1;
  uVar13 = 1;
  if (1 < (int)uVar9) {
    uVar13 = (ulong)uVar9;
  }
  uVar14 = 0;
  do {
    auStack_238[uVar14] = 0xffffffffffffffff;
    auStack_438[uVar14] = 0xffffffffffffffff;
    uVar14 = uVar14 + 1;
  } while (uVar13 != uVar14);
  if (nVarsB != 0x1f) {
    uVar13 = 1;
    if (1 < (int)uVar2) {
      uVar13 = (ulong)uVar2;
    }
    uVar14 = 0;
    uVar15 = 0;
    uVar10 = 0;
    uVar2 = 0;
    do {
      uVar17 = p[(int)uVar2 >> (bVar5 & 0x1f)] >> ((byte)(uVar2 << (bVar1 & 0x1f)) & 0x3f) &
               ~(-1L << ((byte)(1 << (bVar1 & 0x1f)) & 0x3f));
      if ((auStack_438[(int)uVar15] == 0xffffffffffffffff) || (auStack_438[(int)uVar15] == uVar17))
      {
        auStack_438[(int)uVar15] = uVar17;
      }
      else {
        if ((auStack_238[(int)uVar15] != 0xffffffffffffffff) && (auStack_238[(int)uVar15] != uVar17)
           ) {
          return 0;
        }
        auStack_238[(int)uVar15] = uVar17;
        if (pDec != (word *)0x0) {
          iVar3 = (uVar15 << ((byte)(nVarsB - nVarsS) & 0x1f)) + uVar10;
          pDec[iVar3 >> 6] = pDec[iVar3 >> 6] | 1L << ((byte)iVar3 & 0x3f);
        }
      }
      uVar4 = pSched[uVar14];
      if (((uint)uMaskS >> (uVar4 & 0x1f) & 1) == 0) {
        uVar10 = uVar10 ^ 1 << (local_4b8[(long)(int)uVar4 * 4] & 0x1f);
      }
      else {
        uVar15 = uVar15 ^ 1 << (local_478[(long)(int)uVar4 * 4] & 0x1f);
      }
      uVar2 = uVar2 ^ 1 << (uVar4 & 0x1f);
      uVar14 = uVar14 + 1;
    } while (uVar13 != uVar14);
  }
  if (pComp != (word *)0x0) {
    uVar13 = 1;
    if (1 < (int)uVar9) {
      uVar13 = (ulong)uVar9;
    }
    uVar14 = 0;
    do {
      uVar17 = auStack_438[uVar14];
      uVar2 = (uint)uVar14;
      pComp[uVar2 >> (bVar5 & 0x1f)] =
           pComp[uVar2 >> (bVar5 & 0x1f)] | uVar17 << ((byte)(uVar2 << (bVar1 & 0x1f)) & 0x3f);
      uVar16 = auStack_238[uVar14];
      if (auStack_238[uVar14] == 0xffffffffffffffff) {
        uVar16 = uVar17;
      }
      pComp[(int)(uVar9 + uVar2) >> (bVar5 & 0x1f)] =
           pComp[(int)(uVar9 + uVar2) >> (bVar5 & 0x1f)] |
           uVar16 << ((byte)(uVar9 + uVar2 << (bVar1 & 0x1f)) & 0x3f);
      uVar14 = uVar14 + 1;
    } while (uVar13 != uVar14);
    iVar3 = nVarsS + nVarsF;
    if (iVar3 < 5) {
      if (iVar3 < -1) goto LAB_005133b4;
      uVar9 = iVar3 + 1;
      uVar2 = 1;
      if (1 < uVar9) {
        uVar2 = uVar9;
      }
      uVar10 = 2;
      if (1 < uVar9) {
        uVar10 = uVar2;
      }
      uVar2 = 3;
      if (uVar10 != 2) {
        uVar2 = uVar10;
      }
      uVar15 = 4;
      if (uVar2 != 3) {
        uVar15 = uVar2;
      }
      uVar4 = 5;
      if (uVar15 != 4) {
        uVar4 = uVar15;
      }
      if (1 < uVar4 - 5) goto LAB_005133d3;
      uVar11 = (uint)*pComp;
      uVar12 = (uVar11 & 1) * 3;
      if (uVar9 != 0) {
        uVar12 = uVar11;
      }
      uVar13 = (ulong)(uVar12 & 3) * 5;
      if (1 < uVar9) {
        uVar13 = *pComp;
      }
      uVar9 = (uint)uVar13 & 0xf;
      uVar14 = (ulong)(uVar9 << 4 | uVar9);
      if (uVar10 != 2) {
        uVar14 = uVar13;
      }
      uVar13 = (ulong)(uint)((int)(uVar14 & 0xff) << 8) | uVar14 & 0xff;
      if (uVar2 != 3) {
        uVar13 = uVar14;
      }
      uVar14 = (ulong)(uint)((int)uVar13 << 0x10) | uVar13 & 0xffff;
      if (uVar15 != 4) {
        uVar14 = uVar13;
      }
      uVar13 = uVar14 << 0x20 | uVar14 & 0xffffffff;
      if (uVar4 != 5) {
        uVar13 = uVar14;
      }
      *pComp = uVar13;
    }
  }
  if (nVarsB < 6 && pDec != (word *)0x0) {
    if (nVarsB < 0) {
LAB_005133b4:
      __assert_fail("nVars >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                    ,0x489,"word Abc_Tt6Stretch(word, int)");
    }
    iVar3 = 1;
    if (1U < (uint)nVarsB) {
      iVar3 = nVarsB;
    }
    iVar6 = 2;
    if (1U < (uint)nVarsB) {
      iVar6 = iVar3;
    }
    iVar3 = 3;
    if (iVar6 != 2) {
      iVar3 = iVar6;
    }
    iVar8 = 4;
    if (iVar3 != 3) {
      iVar8 = iVar3;
    }
    iVar7 = 5;
    if (iVar8 != 4) {
      iVar7 = iVar8;
    }
    if (1 < iVar7 - 5U) {
LAB_005133d3:
      __assert_fail("nVars == 6",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                    ,0x496,"word Abc_Tt6Stretch(word, int)");
    }
    uVar9 = (uint)*pDec;
    uVar2 = (uVar9 & 1) * 3;
    if (nVarsB != 0) {
      uVar2 = uVar9;
    }
    uVar13 = (ulong)(uVar2 & 3) * 5;
    if (1 < (uint)nVarsB) {
      uVar13 = *pDec;
    }
    uVar2 = (uint)uVar13 & 0xf;
    uVar14 = (ulong)(uVar2 << 4 | uVar2);
    if (iVar6 != 2) {
      uVar14 = uVar13;
    }
    uVar13 = (ulong)(uint)((int)(uVar14 & 0xff) << 8) | uVar14 & 0xff;
    if (iVar3 != 3) {
      uVar13 = uVar14;
    }
    uVar14 = (ulong)(uint)((int)uVar13 << 0x10) | uVar13 & 0xffff;
    if (iVar8 != 4) {
      uVar14 = uVar13;
    }
    uVar13 = uVar14 << 0x20 | uVar14 & 0xffffffff;
    if (iVar7 != 5) {
      uVar13 = uVar14;
    }
    *pDec = uVar13;
  }
  return 1;
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////
 
/**Function*************************************************************

  Synopsis    [Checks decomposability with given variable set.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Dau_DecCheckSetTop5( word * p, int nVars, int nVarsF, int nVarsB, int nVarsS, int uMaskS, int * pSched, word * pDec, word * pComp )
{
    word Cof[2][64], Value;
    word MaskFF = (((word)1) << (1 << nVarsF)) - 1;
    int ShiftF = 6 - nVarsF, MaskF = (1 << ShiftF) - 1;
    int pVarsS[16], pVarsB[16];
    int nMints  = (1 << nVarsB);
    int nMintsB = (1 <<(nVarsB-nVarsS));
    int nMintsS = (1 << nVarsS);
    int s, b, v, m, Mint, MintB, MintS;
    assert( nVars == nVarsB + nVarsF );
    assert( nVars <= 16 );
    assert( nVarsS <= 6 );
    assert( nVarsF >= 1 && nVarsF <= 5 );
    // collect bound/shared variables
    for ( s = b = v = 0; v < nVarsB; v++ )
        if ( (uMaskS >> v) & 1 )
            pVarsB[v] = -1, pVarsS[v] = s++;
        else
            pVarsS[v] = -1, pVarsB[v] = b++;
    assert( s == nVarsS );
    assert( b == nVarsB-nVarsS );
    // clean minterm storage
    for ( s = 0; s < nMintsS; s++ )
        Cof[0][s] = Cof[1][s] = ~(word)0;
    // iterate through bound set minters
    for ( MintS = MintB = Mint = m = 0; m < nMints; m++ )
    {
        // find minterm value
        Value = (p[Mint>>ShiftF] >> ((Mint&MaskF)<<nVarsF)) & MaskFF;
        // check if this cof already appeared 
        if ( !~Cof[0][MintS] || Cof[0][MintS] == Value )
            Cof[0][MintS] = Value;
        else if ( !~Cof[1][MintS] || Cof[1][MintS] == Value )
        {
            Cof[1][MintS] = Value;
            if ( pDec ) 
            {
                int iMintB = MintS * nMintsB + MintB;
                pDec[iMintB>>6] |= (((word)1)<<(iMintB & 63));     
            }
        }
        else
            return 0;            
        // find next minterm
        v = pSched[m];
        Mint ^= (1 << v);
        if ( (uMaskS >> v) & 1 ) // shared variable
            MintS ^= (1 << pVarsS[v]);
        else
            MintB ^= (1 << pVarsB[v]);
    }
    // create composition function
    if ( pComp )
    {
        for ( s = 0; s < nMintsS; s++ )
        {
            pComp[s>>ShiftF] |= (Cof[0][s] << ((s&MaskF) << nVarsF));
            if ( ~Cof[1][s] ) 
                pComp[(s+nMintsS)>>ShiftF] |= (Cof[1][s] << (((s+nMintsS)&MaskF) << nVarsF));
            else
                pComp[(s+nMintsS)>>ShiftF] |= (Cof[0][s] << (((s+nMintsS)&MaskF) << nVarsF));
        }
        if ( nVarsF + nVarsS + 1 < 6 )
            pComp[0] = Abc_Tt6Stretch( pComp[0], nVarsF + nVarsS + 1 );
    }
    if ( pDec && nVarsB < 6 )
        pDec[0] = Abc_Tt6Stretch( pDec[0], nVarsB );
    return 1;
}